

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O3

void drawScene(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double __x;
  double dVar10;
  GLfloat model_specular [4];
  GLfloat model_diffuse [4];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0x3f4ccccd3f800000;
  uStack_20 = 0x3f8000003f4ccccd;
  local_38 = 0x3f19999a;
  uStack_34 = 0x3f19999a;
  uStack_30 = 0x3f19999a;
  uStack_2c = 0x3f800000;
  glPushMatrix();
  glRotatef((float)rot_x * 0.5,0x3f800000,0,0);
  glRotatef((float)rot_y * 0.5,0,0x3f800000,0);
  glRotatef((float)rot_z * 0.5,0,0,0x3f800000);
  glColor4fv(&local_28);
  glMaterialfv(0x404,0x1201,&local_28);
  glMaterialfv(0x404,0x1202,&local_38);
  glMaterialf(0x41a00000,0x404,0x1601);
  if (drawTorus_torus_list == 0) {
    drawTorus_torus_list = glGenLists(1);
    glNewList(drawTorus_torus_list,0x1301);
    iVar5 = 0;
    do {
      glBegin(8);
      uVar6 = 0;
      do {
        __x = (double)(uVar6 & 0x1f) * 6.283185307179586 * 0.03125;
        iVar7 = 1;
        do {
          dVar1 = ((double)(iVar5 + iVar7 & 0x1f) + 0.5) * 6.283185307179586 * 0.03125;
          dVar2 = cos(dVar1);
          dVar3 = cos(__x);
          dVar3 = dVar3 * (dVar2 * 0.5 + 1.5);
          dVar2 = sin(dVar1);
          dVar2 = dVar2 * 0.5;
          dVar1 = cos(dVar1);
          dVar4 = sin(__x);
          dVar4 = dVar4 * (dVar1 * 0.5 + 1.5);
          dVar1 = cos(__x);
          dVar9 = dVar1 * -1.5 + dVar3;
          dVar1 = sin(__x);
          dVar1 = dVar1 * -1.5 + dVar4;
          dVar10 = 1.0 / SQRT(dVar1 * dVar1 + dVar9 * dVar9 + dVar2 * dVar2);
          glNormal3f((float)(dVar9 * dVar10),
                     CONCAT44((int)((ulong)(dVar2 * dVar10) >> 0x20),(float)(dVar2 * dVar10)),
                     CONCAT44((int)((ulong)(dVar10 * dVar1) >> 0x20),(float)(dVar10 * dVar1)));
          glVertex3f((float)dVar3,(float)dVar2,(float)dVar4);
          bVar8 = iVar7 != 0;
          iVar7 = iVar7 + -1;
        } while (bVar8);
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x21);
      glEnd();
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x20);
    glEndList();
  }
  else {
    glCallList();
  }
  glPopMatrix();
  return;
}

Assistant:

static void drawScene(void)
{
    const GLfloat model_diffuse[4]  = {1.0f, 0.8f, 0.8f, 1.0f};
    const GLfloat model_specular[4] = {0.6f, 0.6f, 0.6f, 1.0f};
    const GLfloat model_shininess   = 20.0f;

    glPushMatrix();

    // Rotate the object
    glRotatef((GLfloat) rot_x * 0.5f, 1.0f, 0.0f, 0.0f);
    glRotatef((GLfloat) rot_y * 0.5f, 0.0f, 1.0f, 0.0f);
    glRotatef((GLfloat) rot_z * 0.5f, 0.0f, 0.0f, 1.0f);

    // Set model color (used for orthogonal views, lighting disabled)
    glColor4fv(model_diffuse);

    // Set model material (used for perspective view, lighting enabled)
    glMaterialfv(GL_FRONT, GL_DIFFUSE, model_diffuse);
    glMaterialfv(GL_FRONT, GL_SPECULAR, model_specular);
    glMaterialf(GL_FRONT, GL_SHININESS, model_shininess);

    // Draw torus
    drawTorus();

    glPopMatrix();
}